

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TestSuite_Internals.cpp
# Opt level: O0

bool __thiscall
psy::C::InternalsTestSuite::checkErrorAndWarn(InternalsTestSuite *this,Expectation *X)

{
  __node_base_ptr *this_00;
  bool bVar1;
  char cVar2;
  pointer this_01;
  reference this_02;
  string *id_00;
  value_type *pvVar3;
  ostream *poVar4;
  void *pvVar5;
  undefined8 uVar6;
  size_type sVar7;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_240;
  reference local_220;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *idP_1;
  iterator __end3_1;
  iterator __begin3_1;
  unordered_set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *__range3_1;
  undefined1 local_1e0 [8];
  string msg_1;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *id_1;
  iterator __end1_2;
  iterator __begin1_2;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *__range1_2;
  reference local_180;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *idP;
  iterator __end3;
  iterator __begin3;
  unordered_set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *__range3;
  undefined1 local_140 [8];
  string msg;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *id;
  iterator __end1_1;
  iterator __begin1_1;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *__range1_1;
  Diagnostic *diagnostic;
  iterator __end1;
  iterator __begin1;
  vector<psy::Diagnostic,_std::allocator<psy::Diagnostic>_> local_b8;
  vector<psy::Diagnostic,_std::allocator<psy::Diagnostic>_> *local_a0;
  vector<psy::Diagnostic,_std::allocator<psy::Diagnostic>_> *__range1;
  unordered_set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  W_IDs;
  unordered_set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  E_IDs;
  int W_cnt;
  int E_cnt;
  Expectation *X_local;
  InternalsTestSuite *this_local;
  
  E_IDs._M_h._M_single_bucket._4_4_ = 0;
  E_IDs._M_h._M_single_bucket._0_4_ = 0;
  std::
  unordered_set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::unordered_set((unordered_set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   *)&W_IDs._M_h._M_single_bucket);
  std::
  unordered_set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::unordered_set((unordered_set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   *)&__range1);
  this_01 = std::unique_ptr<psy::C::SyntaxTree,_std::default_delete<psy::C::SyntaxTree>_>::
            operator->(&this->tree_);
  SyntaxTree::diagnostics(&local_b8,this_01);
  local_a0 = &local_b8;
  __end1 = std::vector<psy::Diagnostic,_std::allocator<psy::Diagnostic>_>::begin(local_a0);
  diagnostic = (Diagnostic *)
               std::vector<psy::Diagnostic,_std::allocator<psy::Diagnostic>_>::end(local_a0);
  do {
    bVar1 = __gnu_cxx::operator!=
                      (&__end1,(__normal_iterator<psy::Diagnostic_*,_std::vector<psy::Diagnostic,_std::allocator<psy::Diagnostic>_>_>
                                *)&diagnostic);
    if (!bVar1) {
      std::vector<psy::Diagnostic,_std::allocator<psy::Diagnostic>_>::~vector(&local_b8);
      if ((X->numW_ != (int)E_IDs._M_h._M_single_bucket) ||
         (X->numE_ != E_IDs._M_h._M_single_bucket._4_4_)) {
        std::operator<<((ostream *)&std::cout,"mismatch in ");
        if (X->numW_ == (int)E_IDs._M_h._M_single_bucket) {
          std::operator<<((ostream *)&std::cout,"ERROR");
        }
        else {
          std::operator<<((ostream *)&std::cout,"WARNING");
        }
        std::operator<<((ostream *)&std::cout," count");
      }
      if ((int)E_IDs._M_h._M_single_bucket == X->numW_) {
        if (E_IDs._M_h._M_single_bucket._4_4_ != X->numE_) {
          poVar4 = std::operator<<((ostream *)&std::cout,"\n!\tFAIL\n");
          poVar4 = std::operator<<(poVar4,"\t\tActual  : ");
          poVar4 = (ostream *)std::ostream::operator<<(poVar4,E_IDs._M_h._M_single_bucket._4_4_);
          poVar4 = std::operator<<(poVar4,"\n");
          poVar4 = std::operator<<(poVar4,"\t\tExpected: ");
          poVar4 = (ostream *)std::ostream::operator<<(poVar4,X->numE_);
          poVar4 = std::operator<<(poVar4,"\n");
          poVar4 = std::operator<<(poVar4,"\t\t");
          poVar4 = std::operator<<(poVar4,
                                   "/workspace/llm4binary/github/license_c_cmakelists/ltcmelo[P]psychec/C/tests/TestSuite_Internals.cpp"
                                  );
          poVar4 = std::operator<<(poVar4,":");
          pvVar5 = (void *)std::ostream::operator<<(poVar4,0x9f);
          std::ostream::operator<<(pvVar5,std::endl<char,std::char_traits<char>>);
          uVar6 = __cxa_allocate_exception(1);
          __cxa_throw(uVar6,&TestFailed::typeinfo,0);
        }
        __end1_1 = std::
                   vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   ::begin(&X->descriptorsW_);
        id = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             std::
             vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             ::end(&X->descriptorsW_);
        while( true ) {
          bVar1 = __gnu_cxx::operator!=
                            (&__end1_1,
                             (__normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                              *)&id);
          if (!bVar1) {
            __end1_2 = std::
                       vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                       ::begin(&X->descriptorsE_);
            id_1 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                   std::
                   vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   ::end(&X->descriptorsE_);
            while( true ) {
              bVar1 = __gnu_cxx::operator!=
                                (&__end1_2,
                                 (__normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                                  *)&id_1);
              if (!bVar1) {
                if ((X->numE_ == 0) || ((X->continueTestDespiteOfErrors_ & 1U) != 0)) {
                  this_local._7_1_ = true;
                }
                else {
                  this_local._7_1_ = false;
                }
                std::
                unordered_set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                ::~unordered_set((unordered_set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                  *)&__range1);
                std::
                unordered_set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                ::~unordered_set((unordered_set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                  *)&W_IDs._M_h._M_single_bucket);
                return this_local._7_1_;
              }
              msg_1.field_2._8_8_ =
                   __gnu_cxx::
                   __normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                   ::operator*(&__end1_2);
              sVar7 = std::
                      unordered_set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                      ::count((unordered_set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                               *)&W_IDs._M_h._M_single_bucket,(key_type *)msg_1.field_2._8_8_);
              if (sVar7 == 0) break;
              __gnu_cxx::
              __normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
              ::operator++(&__end1_2);
            }
            std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                           &__range3_1,"ERROR ",
                           (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                           msg_1.field_2._8_8_);
            std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                           local_1e0,
                           (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                           &__range3_1," not found, got:");
            std::__cxx11::string::~string((string *)&__range3_1);
            this_00 = &W_IDs._M_h._M_single_bucket;
            __end3_1 = std::
                       unordered_set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                       ::begin((unordered_set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                *)this_00);
            idP_1 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                    std::
                    unordered_set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    ::end((unordered_set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                           *)this_00);
            while (bVar1 = std::__detail::operator!=
                                     (&__end3_1.
                                       super__Node_iterator_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true>
                                      ,(_Node_iterator_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true>
                                        *)&idP_1), bVar1) {
              local_220 = std::__detail::
                          _Node_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true,_true>
                          ::operator*(&__end3_1);
              std::operator+(&local_240,"\n\t\t- ",local_220);
              std::__cxx11::string::operator+=((string *)local_1e0,(string *)&local_240);
              std::__cxx11::string::~string((string *)&local_240);
              std::__detail::
              _Node_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true,_true>
              ::operator++(&__end3_1);
            }
            poVar4 = std::operator<<((ostream *)&std::cout,"\n!\tFAIL\n");
            poVar4 = std::operator<<(poVar4,"\tReason: ");
            poVar4 = std::operator<<(poVar4,(string *)local_1e0);
            poVar4 = std::operator<<(poVar4,"\n");
            poVar4 = std::operator<<(poVar4,"\t\t");
            poVar4 = std::operator<<(poVar4,
                                     "/workspace/llm4binary/github/license_c_cmakelists/ltcmelo[P]psychec/C/tests/TestSuite_Internals.cpp"
                                    );
            poVar4 = std::operator<<(poVar4,":");
            pvVar5 = (void *)std::ostream::operator<<(poVar4,0xaf);
            std::ostream::operator<<(pvVar5,std::endl<char,std::char_traits<char>>);
            uVar6 = __cxa_allocate_exception(1);
            __cxa_throw(uVar6,&TestFailed::typeinfo,0);
          }
          msg.field_2._8_8_ =
               __gnu_cxx::
               __normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
               ::operator*(&__end1_1);
          sVar7 = std::
                  unordered_set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  ::count((unordered_set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                           *)&__range1,(key_type *)msg.field_2._8_8_);
          if (sVar7 == 0) break;
          __gnu_cxx::
          __normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
          ::operator++(&__end1_1);
        }
        std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                       &__range3,"WARNING ",
                       (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                       msg.field_2._8_8_);
        std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                       local_140,
                       (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                       &__range3," not found, got:");
        std::__cxx11::string::~string((string *)&__range3);
        __end3 = std::
                 unordered_set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 ::begin((unordered_set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                          *)&__range1);
        idP = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
              std::
              unordered_set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ::end((unordered_set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     *)&__range1);
        while (bVar1 = std::__detail::operator!=
                                 (&__end3.
                                   super__Node_iterator_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true>
                                  ,(_Node_iterator_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true>
                                    *)&idP), bVar1) {
          local_180 = std::__detail::
                      _Node_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true,_true>
                      ::operator*(&__end3);
          std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                         &__range1_2,"\n\t\t- ",local_180);
          std::__cxx11::string::operator+=((string *)local_140,(string *)&__range1_2);
          std::__cxx11::string::~string((string *)&__range1_2);
          std::__detail::
          _Node_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true,_true>
          ::operator++(&__end3);
        }
        poVar4 = std::operator<<((ostream *)&std::cout,"\n!\tFAIL\n");
        poVar4 = std::operator<<(poVar4,"\tReason: ");
        poVar4 = std::operator<<(poVar4,(string *)local_140);
        poVar4 = std::operator<<(poVar4,"\n");
        poVar4 = std::operator<<(poVar4,"\t\t");
        poVar4 = std::operator<<(poVar4,
                                 "/workspace/llm4binary/github/license_c_cmakelists/ltcmelo[P]psychec/C/tests/TestSuite_Internals.cpp"
                                );
        poVar4 = std::operator<<(poVar4,":");
        pvVar5 = (void *)std::ostream::operator<<(poVar4,0xa6);
        std::ostream::operator<<(pvVar5,std::endl<char,std::char_traits<char>>);
        uVar6 = __cxa_allocate_exception(1);
        __cxa_throw(uVar6,&TestFailed::typeinfo,0);
      }
      poVar4 = std::operator<<((ostream *)&std::cout,"\n!\tFAIL\n");
      poVar4 = std::operator<<(poVar4,"\t\tActual  : ");
      poVar4 = (ostream *)std::ostream::operator<<(poVar4,(int)E_IDs._M_h._M_single_bucket);
      poVar4 = std::operator<<(poVar4,"\n");
      poVar4 = std::operator<<(poVar4,"\t\tExpected: ");
      poVar4 = (ostream *)std::ostream::operator<<(poVar4,X->numW_);
      poVar4 = std::operator<<(poVar4,"\n");
      poVar4 = std::operator<<(poVar4,"\t\t");
      poVar4 = std::operator<<(poVar4,
                               "/workspace/llm4binary/github/license_c_cmakelists/ltcmelo[P]psychec/C/tests/TestSuite_Internals.cpp"
                              );
      poVar4 = std::operator<<(poVar4,":");
      pvVar5 = (void *)std::ostream::operator<<(poVar4,0x9e);
      std::ostream::operator<<(pvVar5,std::endl<char,std::char_traits<char>>);
      uVar6 = __cxa_allocate_exception(1);
      __cxa_throw(uVar6,&TestFailed::typeinfo,0);
    }
    this_02 = __gnu_cxx::
              __normal_iterator<psy::Diagnostic_*,_std::vector<psy::Diagnostic,_std::allocator<psy::Diagnostic>_>_>
              ::operator*(&__end1);
    if ((X->containsAmbiguity_ & 1U) == 0) {
LAB_00585581:
      cVar2 = psy::Diagnostic::severity();
      if (cVar2 == '\x02') {
        E_IDs._M_h._M_single_bucket._4_4_ = E_IDs._M_h._M_single_bucket._4_4_ + 1;
        Diagnostic::descriptor(this_02);
        pvVar3 = (value_type *)psy::DiagnosticDescriptor::id_abi_cxx11_();
        std::
        unordered_set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ::insert((unordered_set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  *)&W_IDs._M_h._M_single_bucket,pvVar3);
      }
      else {
        cVar2 = psy::Diagnostic::severity();
        if (cVar2 == '\x01') {
          E_IDs._M_h._M_single_bucket._0_4_ = (int)E_IDs._M_h._M_single_bucket + 1;
          Diagnostic::descriptor(this_02);
          pvVar3 = (value_type *)psy::DiagnosticDescriptor::id_abi_cxx11_();
          std::
          unordered_set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ::insert((unordered_set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    *)&__range1,pvVar3);
        }
      }
    }
    else {
      Diagnostic::descriptor(this_02);
      id_00 = (string *)psy::DiagnosticDescriptor::id_abi_cxx11_();
      bVar1 = isDiagnosticDescriptorIdOfSyntaxAmbiguity(id_00);
      if (!bVar1) goto LAB_00585581;
    }
    __gnu_cxx::
    __normal_iterator<psy::Diagnostic_*,_std::vector<psy::Diagnostic,_std::allocator<psy::Diagnostic>_>_>
    ::operator++(&__end1);
  } while( true );
}

Assistant:

bool InternalsTestSuite::checkErrorAndWarn(Expectation X)
{
    int E_cnt = 0;
    int W_cnt = 0;
    std::unordered_set<std::string> E_IDs;
    std::unordered_set<std::string> W_IDs;
    for (const auto& diagnostic : tree_->diagnostics()) {
        if (X.containsAmbiguity_
                && isDiagnosticDescriptorIdOfSyntaxAmbiguity(diagnostic.descriptor().id()))
            continue;

        if (diagnostic.severity() == DiagnosticSeverity::Error) {
            ++E_cnt;
            E_IDs.insert(diagnostic.descriptor().id());
        }
        else if (diagnostic.severity() == DiagnosticSeverity::Warning) {
            ++W_cnt;
            W_IDs.insert(diagnostic.descriptor().id());
        }
    }

#ifdef DBG_DIAGNOSTICS
    if (!tree_->diagnostics().empty()) {
        for (auto& diagnostic : tree_->diagnostics()) {
            diagnostic.outputIndent_ = 2;
            std::cout << std::endl << diagnostic << std::endl;
        }
        std::cout << "\t";
    }
#endif

    if (X.numW_ != W_cnt || X.numE_ != E_cnt) {
#ifdef DBG_DIAGNOSTICS
        std::cout << "\n\t" << std::string(25, '%') << "\n\t";
#endif
        std::cout << "mismatch in ";
        if (X.numW_ != W_cnt)
            std::cout << "WARNING";
        else
            std::cout << "ERROR";
        std::cout << " count";

#ifdef DBG_DIAGNOSTICS
        std::cout << "\n\t" << std::string(25, '%');
#endif
    }

    PSY_EXPECT_EQ_INT(W_cnt, X.numW_);
    PSY_EXPECT_EQ_INT(E_cnt, X.numE_);

    for (const auto& id : X.descriptorsW_) {
        if (!W_IDs.count(id)) {
            std::string msg = "WARNING " + id + " not found, got:";
            for (const auto& idP : W_IDs)
                msg += "\n\t\t- " + idP;
            PSY__internals__FAIL(msg);
        }
    }

    for (const auto& id : X.descriptorsE_) {
        if (!E_IDs.count(id)) {
            std::string msg = "ERROR " + id + " not found, got:";
            for (const auto& idP : E_IDs)
                msg += "\n\t\t- " + idP;
            PSY__internals__FAIL(msg);
        }
    }

    if (X.numE_ && !X.continueTestDespiteOfErrors_)
        return false;

    return true;
}